

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNearestNeighborsClassifierValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)404>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  Type *pTVar4;
  ostream *poVar5;
  int iVar6;
  undefined1 *int64Parameter;
  int iVar7;
  int iVar8;
  undefined1 *puVar9;
  Result res;
  stringstream out;
  undefined4 in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  ostream *local_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  if (format->_oneof_case_[0] == 0x194) {
    puVar9 = (undefined1 *)(format->Type_).neuralnetworkregressor_;
  }
  else {
    puVar9 = Specification::_KNearestNeighborsClassifier_default_instance_;
  }
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"numberOfNeighbors","");
  int64Parameter =
       *(undefined1 **)
        &(((NeuralNetworkRegressor *)puVar9)->layers_).super_RepeatedPtrFieldBase.current_size_;
  if ((Int64Parameter *)int64Parameter == (Int64Parameter *)0x0) {
    int64Parameter = Specification::_Int64Parameter_default_instance_;
  }
  validateInt64Parameter
            ((Result *)&local_1d8,(string *)local_1b0,(Int64Parameter *)int64Parameter,true);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_1d8);
  if (!bVar3) {
LAB_0030a01a:
    *(ostream **)__return_storage_ptr__ = local_1d8;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p == &local_1c0) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_1c0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_1d0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_1c8;
    local_1c8 = 0;
    local_1c0._M_local_buf[0] = '\0';
    local_1d0._M_p = (pointer)&local_1c0;
    goto LAB_0030a487;
  }
  cVar2 = (char)(ostream *)local_1a0;
  if (*(int *)((long)&((NeuralNetworkRegressor *)puVar9)->updateparams_ + 4) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "KNearestNeighborsClassifier requires a weighting scheme to be set.",0x42);
    std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                   (string *)&stack0xfffffffffffffe08);
  }
  else {
    iVar8 = *(int *)((long)&(((NeuralNetworkRegressor *)puVar9)->preprocessing_).
                            super_RepeatedPtrFieldBase.rep_ + 4);
    iVar7 = 0;
    iVar6 = 0;
    if (iVar8 == 0x65) {
      iVar6 = *(int *)(((((NeuralNetworkRegressor *)puVar9)->layers_).super_RepeatedPtrFieldBase.
                       rep_)->elements + 1);
    }
    if (iVar8 == 100) {
      iVar7 = *(int *)(((((NeuralNetworkRegressor *)puVar9)->layers_).super_RepeatedPtrFieldBase.
                       rep_)->elements + 2);
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    iVar6 = *(int *)&((NeuralNetworkRegressor *)puVar9)->updateparams_;
    if (iVar6 == 0) {
      if (iVar7 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "KNearestNeighborsClassifier should specify default class labels when class labels are not specified."
                   ,100);
        std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                       (string *)&stack0xfffffffffffffe08);
      }
      else {
LAB_00309f8d:
        bVar3 = false;
LAB_00309f8f:
        if (format->_oneof_case_[0] == 0x194) {
          puVar9 = (undefined1 *)(format->Type_).pipelineclassifier_;
        }
        else {
          puVar9 = Specification::_KNearestNeighborsClassifier_default_instance_;
        }
        in_stack_fffffffffffffe08 = 0;
        validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
                  ((Result *)local_1b0,(CoreML *)format,(Model *)puVar9,
                   (KNearestNeighborsClassifier *)0x1,bVar3,SUB81(&stack0xfffffffffffffe08,0),
                   (ValidationPolicy *)((ulong)in_stack_fffffffffffffe0c << 0x20));
        local_1d8 = (ostream *)local_1b0;
        std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_1a8);
        if (local_1a8._M_p != local_1a0 + 8) {
          operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
        }
        bVar3 = Result::good((Result *)&local_1d8);
        if (!bVar3) goto LAB_0030a01a;
        if (format->_oneof_case_[0] == 0x194) {
          puVar9 = (undefined1 *)(format->Type_).knearestneighborsclassifier_;
        }
        else {
          puVar9 = Specification::_KNearestNeighborsClassifier_default_instance_;
        }
        puVar9 = (undefined1 *)((KNearestNeighborsClassifier *)puVar9)->nearestneighborsindex_;
        if ((NearestNeighborsIndex *)puVar9 == (NearestNeighborsIndex *)0x0) {
          puVar9 = Specification::_NearestNeighborsIndex_default_instance_;
        }
        iVar8 = (((NearestNeighborsIndex *)puVar9)->floatsamples_).super_RepeatedPtrFieldBase.
                current_size_;
        if ((iVar7 == 0) || (iVar8 != 0)) {
          if (iVar8 == iVar7) {
            if (0 < iVar8) {
              iVar8 = 0;
              do {
                pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                                   (&(((NearestNeighborsIndex *)puVar9)->floatsamples_).
                                     super_RepeatedPtrFieldBase,iVar8);
                if ((pTVar4->vector_).current_size_ !=
                    ((NearestNeighborsIndex *)puVar9)->numberofdimensions_) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,"Unexpected length \"",0x13);
                  poVar5 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)local_1a0,
                                      (((NearestNeighborsIndex *)puVar9)->floatsamples_).
                                      super_RepeatedPtrFieldBase.current_size_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar5,"\" given the provided number of dimensions \"",0x2b);
                  poVar5 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)poVar5,
                                      ((NearestNeighborsIndex *)puVar9)->numberofdimensions_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
                  std::ostream::put((char)poVar5);
                  std::ostream::flush();
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                 (string *)&stack0xfffffffffffffe08);
                  goto LAB_0030a44e;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < (((NearestNeighborsIndex *)puVar9)->floatsamples_).
                               super_RepeatedPtrFieldBase.current_size_);
            }
            if (((NearestNeighborsIndex *)puVar9)->_oneof_case_[0] == 100) {
LAB_0030a150:
              if (((NearestNeighborsIndex *)puVar9)->_oneof_case_[1] != 0) {
                Result::Result(__return_storage_ptr__);
                goto LAB_0030a487;
              }
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,
                         "KNearestNeighborsClassifier requires a distance function to be set.",0x43)
              ;
              std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                             (string *)&stack0xfffffffffffffe08);
            }
            else if (((NearestNeighborsIndex *)puVar9)->_oneof_case_[0] == 0x6e) {
              if (0 < ((((NearestNeighborsIndex *)puVar9)->IndexType_).singlekdtreeindex_)->
                      leafsize_) goto LAB_0030a150;
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,
                         "KNearestNeighborsClassifier requires leaf size to be a positive integer.",
                         0x48);
              std::endl<char,std::char_traits<char>>((ostream *)local_1a0);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                             (string *)&stack0xfffffffffffffe08);
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,
                         "KNearestNeighborsClassifier has no index type specified.",0x38);
              std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                             (string *)&stack0xfffffffffffffe08);
            }
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a0,"Unexpected number of labels \"",0x1d);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" for the given number of examples: \"",0x25);
            poVar5 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar5,
                                (((NearestNeighborsIndex *)puVar9)->floatsamples_).
                                super_RepeatedPtrFieldBase.current_size_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                           (string *)&stack0xfffffffffffffe08);
          }
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,"KNearestNeighborsClassifier has no data points.",0x2f);
          std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                         (string *)&stack0xfffffffffffffe08);
        }
      }
    }
    else if (iVar6 == 0x6e) {
      bVar3 = false;
      if ((iVar8 == 0) || (iVar8 == 100)) goto LAB_00309f8f;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "KNearestNeighborsClassifier\'s class label and default class label have different types."
                 ,0x57);
      std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                     (string *)&stack0xfffffffffffffe08);
    }
    else {
      if (iVar6 != 0x6f) goto LAB_00309f8d;
      bVar3 = true;
      if ((iVar8 == 0) || (iVar8 == 0x65)) goto LAB_00309f8f;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "KNearestNeighborsClassifier\'s class label and default class label have different types."
                 ,0x57);
      std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                     (string *)&stack0xfffffffffffffe08);
    }
  }
LAB_0030a44e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08) != &local_1e8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                    local_1e8._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
LAB_0030a487:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    operator_delete(local_1d0._M_p,
                    CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_kNearestNeighborsClassifier>(const Specification::Model& format) {

        const Specification::KNearestNeighborsClassifier& knnClassifier = format.knearestneighborsclassifier();

        Result res = validateInt64Parameter("numberOfNeighbors", knnClassifier.numberofneighbors(), true);
        if (!res.good()) {
            return res;
        }

        switch (knnClassifier.WeightingScheme_case()) {
            case Specification::KNearestNeighborsClassifier::kUniformWeighting:
            case Specification::KNearestNeighborsClassifier::kInverseDistanceWeighting:
                // Valid weighting scheme
                break;

            case Specification::KNearestNeighborsClassifier::WEIGHTINGSCHEME_NOT_SET:
                std::stringstream out;
                out << "KNearestNeighborsClassifier requires a weighting scheme to be set." << std::endl;
                return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
        }

        int intLabelCount = knnClassifier.has_int64classlabels() ? knnClassifier.int64classlabels().vector_size() : 0;
        int stringLabelCount = knnClassifier.has_stringclasslabels() ? knnClassifier.stringclasslabels().vector_size() : 0;

        int labelCount = std::max(intLabelCount, stringLabelCount);

        auto classLabelCase = knnClassifier.ClassLabels_case();
        auto defaultClassLabelIsInt64 = false;

        switch (knnClassifier.DefaultClassLabel_case()) {
            case Specification::KNearestNeighborsClassifier::kDefaultStringLabel:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kStringClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = false;
                break;

            case Specification::KNearestNeighborsClassifier::kDefaultInt64Label:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kInt64ClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = true;
                break;

            case Specification::KNearestNeighborsClassifier::DEFAULTCLASSLABEL_NOT_SET:
                if (labelCount == 0) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier should specify default class labels when class labels are not specified." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
        }

        res = validateClassifierInterface(format, format.knearestneighborsclassifier(), true, defaultClassLabelIsInt64);
        if (!res.good()) {
            return res;
        }


        return validateNearestNeighborsIndex(format, labelCount);

    }